

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::(anonymous_namespace)::ExpandWithIndices<std::array<int,3ul>>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *values,
          uint32_t elementSize,vector<int,_std::allocator<int>_> *indices,
          vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *dest)

{
  uint uVar1;
  long lVar2;
  pointer piVar3;
  size_type sVar4;
  value_type_conflict vVar5;
  long *plVar6;
  undefined4 in_register_0000000c;
  long lVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> invalidIndices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  _Alloc_hider local_90;
  undefined8 local_88;
  ulong local_80;
  long lStack_78;
  ulong *local_70;
  undefined8 local_68;
  ulong local_60;
  long lStack_58;
  string local_50;
  
  plVar6 = (long *)CONCAT44(in_register_0000000c,elementSize);
  if (indices == (vector<int,_std::allocator<int>_> *)0x0) {
    local_90._M_p = "`dest` is nullptr.";
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&local_90);
  }
  else if (*plVar6 == plVar6[1]) {
    std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator=
              ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)indices,
               (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)this);
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = true;
  }
  else if (((int)values == 0) ||
          (uVar9 = (ulong)values & 0xffffffff,
          (ulong)((*(long *)(this + 8) - *(long *)this >> 2) * -0x5555555555555555) % uVar9 != 0)) {
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = false;
  }
  else {
    std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::resize
              ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)indices,
               (plVar6[1] - *plVar6 >> 2) * uVar9);
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (unsigned_long *)0x0;
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    local_90._M_p = (pointer)0x0;
    lVar11 = *plVar6;
    if (plVar6[1] == lVar11) {
      vVar5 = true;
    }
    else {
      vVar5 = true;
      do {
        uVar1 = *(uint *)(lVar11 + (long)local_90._M_p * 4);
        if (((int)uVar1 < 0) ||
           (uVar10 = ((ulong)uVar1 + 1) * uVar9, lVar11 = *(long *)(this + 8) - *(long *)this >> 2,
           (ulong)(lVar11 * -0x5555555555555555) <= uVar10 &&
           uVar10 + lVar11 * 0x5555555555555555 != 0)) {
          if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_a8,
                       (iterator)
                       local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_90);
          }
          else {
            *local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)local_90._M_p;
            local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          vVar5 = false;
        }
        else {
          lVar7 = (ulong)uVar1 * uVar9 * 0xc;
          lVar11 = (long)local_90._M_p * uVar9 * 0xc;
          uVar10 = uVar9;
          do {
            lVar2 = *(long *)this;
            piVar3 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            *(undefined4 *)((long)piVar3 + lVar11 + 8) = *(undefined4 *)(lVar2 + 8 + lVar7);
            *(undefined8 *)((long)piVar3 + lVar11) = *(undefined8 *)(lVar2 + lVar7);
            lVar7 = lVar7 + 0xc;
            lVar11 = lVar11 + 0xc;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
        }
        local_90._M_p = local_90._M_p + 1;
        lVar11 = *plVar6;
      } while (local_90._M_p < (ulong *)(plVar6[1] - lVar11 >> 2));
    }
    if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value = vVar5;
    }
    else {
      tinyusdz::value::print_array_snipped<unsigned_long>(&local_50,&local_a8,5);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x25b3f1);
      puVar8 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar8) {
        local_60 = *puVar8;
        lStack_58 = plVar6[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *puVar8;
        local_70 = (ulong *)*plVar6;
      }
      local_80 = local_60;
      sVar4 = plVar6[1];
      *plVar6 = (long)puVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_70 == &local_60) {
        lStack_78 = lStack_58;
        local_90._M_p = (pointer)&local_80;
      }
      else {
        local_90._M_p = (pointer)local_70;
      }
      local_60 = local_60 & 0xffffffffffffff00;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = false;
      puVar8 = (ulong *)((long)&(__return_storage_ptr__->contained).
                                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                .field_0 + 0x10);
      *(ulong **)
       &(__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0 = puVar8;
      if ((ulong *)local_90._M_p == &local_80) {
        *puVar8 = local_80;
        *(long *)((long)&(__return_storage_ptr__->contained).
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .field_0 + 0x18) = lStack_78;
      }
      else {
        (__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_error._M_dataplus._M_p = local_90._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->contained).
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0 + 0x10) = local_80;
      }
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_error._M_string_length = sVar4;
      local_80 = local_80 & 0xffffffffffffff00;
      local_68 = 0;
      local_88 = 0;
      local_90._M_p = (pointer)&local_80;
      local_70 = &local_60;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
      operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> ExpandWithIndices(
    const std::vector<T> &values, uint32_t elementSize, const std::vector<int32_t> &indices,
    std::vector<T> *dest) {
  if (!dest) {
    return nonstd::make_unexpected("`dest` is nullptr.");
  }

  if (indices.empty()) {
    (*dest) = values;
    return true;
  }

  if (elementSize == 0) {
    return false;
  }

  if ((values.size() % elementSize) != 0) {
    return false;
  }

  dest->resize(indices.size() * elementSize);

  std::vector<size_t> invalidIndices;

  bool valid = true;
  for (size_t i = 0; i < indices.size(); i++) {
    int32_t idx = indices[i];
    if ((idx >= 0) && ((size_t(idx+1) * size_t(elementSize)) <= values.size())) {
      for (size_t k = 0; k < elementSize; k++) {
        (*dest)[i*elementSize + k] = values[size_t(idx)*elementSize + k];
      }
    } else {
      invalidIndices.push_back(i);
      valid = false;
    }
  }

  if (invalidIndices.size()) {
    return nonstd::make_unexpected(
        "Invalid indices found: " +
        value::print_array_snipped(invalidIndices,
                                   /* N to display */ 5));
  }

  return valid;
}